

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void ats_write64(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  byte bVar1;
  uint8_t uVar2;
  _Bool _Var3;
  uint64_t uVar4;
  ARMMMUIdx local_28;
  int secure;
  ARMMMUIdx mmu_idx;
  MMUAccessType access_type;
  uint64_t value_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  bVar1 = ri->opc2;
  _Var3 = arm_is_secure_below_el3(env);
  switch(ri->opc2 & 6) {
  case 0:
    uVar2 = ri->opc1;
    if (uVar2 == '\0') {
      if ((ri->crm == '\t') && ((env->pstate & 0x400000) != 0)) {
        local_28 = ARMMMUIdx_Stage1_E1_PAN;
        if (_Var3) {
          local_28 = ARMMMUIdx_SE10_1_PAN;
        }
      }
      else {
        local_28 = ARMMMUIdx_Stage1_E1;
        if (_Var3) {
          local_28 = ARMMMUIdx_SE10_1;
        }
      }
    }
    else if (uVar2 == '\x04') {
      local_28 = ARMMMUIdx_E2;
    }
    else {
      if (uVar2 != '\x06') {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                   ,0xcac,(char *)0x0);
      }
      local_28 = ARMMMUIdx_SE3;
    }
    break;
  case 2:
    local_28 = ARMMMUIdx_Stage1_E0;
    if (_Var3) {
      local_28 = ARMMMUIdx_SE10_0;
    }
    break;
  case 4:
    local_28 = ARMMMUIdx_E10_1;
    if (_Var3) {
      local_28 = ARMMMUIdx_SE10_1;
    }
    break;
  case 6:
    local_28 = ARMMMUIdx_E10_0;
    if (_Var3) {
      local_28 = ARMMMUIdx_SE10_0;
    }
    break;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
               ,0xcba,(char *)0x0);
  }
  uVar4 = do_ats_write(env,value,bVar1 & MMU_DATA_STORE,local_28);
  (env->cp15).field_26.field_0.par_ns = uVar4;
  return;
}

Assistant:

static void ats_write64(CPUARMState *env, const ARMCPRegInfo *ri,
                        uint64_t value)
{
    MMUAccessType access_type = ri->opc2 & 1 ? MMU_DATA_STORE : MMU_DATA_LOAD;
    ARMMMUIdx mmu_idx = 0;
    int secure = arm_is_secure_below_el3(env);

    switch (ri->opc2 & 6) {
    case 0:
        switch (ri->opc1) {
        case 0: /* AT S1E1R, AT S1E1W, AT S1E1RP, AT S1E1WP */
            if (ri->crm == 9 && (env->pstate & PSTATE_PAN)) {
                mmu_idx = (secure ? ARMMMUIdx_SE10_1_PAN
                           : ARMMMUIdx_Stage1_E1_PAN);
            } else {
                mmu_idx = secure ? ARMMMUIdx_SE10_1 : ARMMMUIdx_Stage1_E1;
            }
            break;
        case 4: /* AT S1E2R, AT S1E2W */
            mmu_idx = ARMMMUIdx_E2;
            break;
        case 6: /* AT S1E3R, AT S1E3W */
            mmu_idx = ARMMMUIdx_SE3;
            break;
        default:
            g_assert_not_reached();
            break;
        }
        break;
    case 2: /* AT S1E0R, AT S1E0W */
        mmu_idx = secure ? ARMMMUIdx_SE10_0 : ARMMMUIdx_Stage1_E0;
        break;
    case 4: /* AT S12E1R, AT S12E1W */
        mmu_idx = secure ? ARMMMUIdx_SE10_1 : ARMMMUIdx_E10_1;
        break;
    case 6: /* AT S12E0R, AT S12E0W */
        mmu_idx = secure ? ARMMMUIdx_SE10_0 : ARMMMUIdx_E10_0;
        break;
    default:
        g_assert_not_reached();
        break;
    }

    env->cp15.par_el[1] = do_ats_write(env, value, access_type, mmu_idx);
}